

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfounded_check.cpp
# Opt level: O2

bool __thiscall Clasp::DefaultUnfoundedCheck::findSource(DefaultUnfoundedCheck *this,NodeId headId)

{
  AtomData AVar1;
  pointer pAVar2;
  uint *puVar3;
  pointer pBVar4;
  IdQueue *this_00;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  uint *puVar8;
  long lVar9;
  pointer pAVar10;
  pointer x;
  uint local_60;
  uint local_5c;
  pointer local_58;
  IdQueue *local_50;
  VarVec *local_48;
  BodyPtr local_40;
  
  local_60 = headId;
  pushUfs(this,headId);
  local_50 = &this->ufs_;
  local_48 = &this->invalidQ_;
  uVar7 = 0;
  while( true ) {
    this_00 = local_50;
    uVar6 = (this->ufs_).qFront;
    if (uVar6 == (this->ufs_).vec.ebo_.size) break;
    (this->ufs_).qFront = uVar6 + 1;
    uVar6 = (this->ufs_).vec.ebo_.buf[uVar6];
    pAVar10 = (this->atoms_).ebo_.buf;
    local_60 = uVar6;
    if ((int)pAVar10[uVar6] < 0) {
      uVar7 = uVar7 + 1;
      pAVar10[uVar6] = (AtomData)((uint)pAVar10[uVar6] & 0xbfffffff);
    }
    else {
      pAVar2 = (this->graph_->atoms_).ebo_.buf;
      puVar3 = pAVar2[uVar6].super_Node.sep_;
      local_5c = uVar7;
      local_58 = pAVar10;
      for (puVar8 = pAVar2[uVar6].super_Node.adj_; pAVar10 = local_58, uVar7 = local_5c,
          puVar8 != puVar3; puVar8 = puVar8 + 1) {
        local_40.id = *puVar8;
        pBVar4 = (this->graph_->bodies_).ebo_.buf;
        local_40.node = pBVar4 + local_40.id;
        uVar7 = pBVar4[local_40.id].super_Node.lit.rep_;
        if ((byte)(*(byte *)((long)(this->solver_->assign_).assign_.ebo_.buf +
                            (ulong)(uVar7 & 0xfffffffc)) & 3) != (byte)(((uVar7 & 2) == 0) + 1U)) {
          if ((((*(uint *)&pAVar2[uVar6].super_Node.field_0x4 ^
                *(uint *)&((local_40.node)->super_Node).field_0x4) & 0xfffffff) != 0) ||
             (bVar5 = isValidSource(this,&local_40), bVar5)) {
            pAVar10 = local_58;
            local_58[uVar6].field_0x3 = local_58[uVar6].field_0x3 & 0xbf;
            setSource(this,local_60,&local_40);
            propagateSource(this);
            uVar7 = local_5c + 1;
            break;
          }
          addUnsourced(this,&local_40);
        }
      }
      if (-1 < (int)pAVar10[uVar6]) {
        bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  (local_48,&local_60);
      }
    }
  }
  (this->ufs_).qFront = 0;
  if (uVar7 != 0) {
    (this->ufs_).vec.ebo_.size = 0;
    if (uVar6 != uVar7) {
      x = (this->invalidQ_).ebo_.buf;
      for (lVar9 = (ulong)(this->invalidQ_).ebo_.size << 2; lVar9 != 0; lVar9 = lVar9 + -4) {
        pAVar10 = (this->atoms_).ebo_.buf;
        AVar1 = pAVar10[*x];
        pAVar10[*x] = (AtomData)((uint)AVar1 & 0xbfffffff | ~(uint)AVar1 >> 1 & 0x40000000);
        if (-1 < (int)AVar1) {
          bk_lib::pod_vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    (&this_00->vec,x);
        }
        x = x + 1;
      }
      uVar6 = (this->ufs_).vec.ebo_.size;
      uVar7 = (this->ufs_).qFront;
      goto LAB_001704dd;
    }
    uVar6 = 0;
  }
  uVar7 = 0;
LAB_001704dd:
  (this->invalidQ_).ebo_.size = 0;
  return uVar7 == uVar6;
}

Assistant:

bool DefaultUnfoundedCheck::findSource(NodeId headId) {
	assert(ufs_.empty() && invalidQ_.empty());
	const NodeId* bodyIt, *bodyEnd;
	uint32 newSource = 0;
	pushUfs(headId); // unfounded, unless we find a new source
	while (!ufs_.empty()) {
		headId         = ufs_.pop_ret(); // still marked and in vector!
		AtomData& head = atoms_[headId];
		if (!head.hasSource()) {
			const AtomNode& headNode = graph_->getAtom(headId);
			for (bodyIt = headNode.bodies_begin(), bodyEnd = headNode.bodies_end(); bodyIt != bodyEnd; ++bodyIt) {
				BodyPtr bodyNode(getBody(*bodyIt));
				if (!solver_->isFalse(bodyNode.node->lit)) {
					if (bodyNode.node->scc != headNode.scc || isValidSource(bodyNode)) {
						head.ufs = 0;               // found a new source,
						setSource(headId, bodyNode);// set the new source
						propagateSource();          // and propagate it forward
						++newSource;
						break;
					}
					else { addUnsourced(bodyNode); }
				}
			}
			if (!head.hasSource()) { // still no source - check again once we are done
				invalidQ_.push_back(headId);
			}
		}
		else {  // head has a source and is thus not unfounded
			++newSource;
			head.ufs = 0;
		}
	} // while unfounded_.emtpy() == false
	ufs_.rewind();
	if (newSource != 0) {
		// some atoms in unfounded_ have a new source
		// clear queue and check possible candidates for atoms that are still unfounded
		uint32 visited = sizeVec(ufs_.vec);
		ufs_.clear();
		if (visited != newSource) {
			// add elements that are still unfounded
			for (VarVec::iterator it = invalidQ_.begin(), end = invalidQ_.end(); it != end; ++it) {
				if ( (atoms_[*it].ufs = (1u - atoms_[*it].validS)) == 1 ) { ufs_.push(*it); }
			}
		}
	}
	invalidQ_.clear();
	return ufs_.empty();
}